

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O0

DWORD * __thiscall
MIDISong2::MakeEvents(MIDISong2 *this,DWORD *events,DWORD *max_event_p,DWORD max_time)

{
  DWORD *pDVar1;
  TrackInfo *pTVar2;
  bool bVar3;
  DWORD *new_events;
  DWORD DStack_40;
  bool sysex_noroom;
  DWORD delay;
  DWORD time;
  DWORD tot_time;
  DWORD *start_events;
  DWORD *pDStack_28;
  DWORD max_time_local;
  DWORD *max_event_p_local;
  DWORD *events_local;
  MIDISong2 *this_local;
  
  delay = 0;
  _time = events;
  start_events._4_4_ = max_time;
  pDStack_28 = max_event_p;
  max_event_p_local = events;
  events_local = (DWORD *)this;
  while( true ) {
    DStack_40 = 0;
    bVar3 = false;
    if ((this->TrackDue != (TrackInfo *)0x0) && (bVar3 = false, max_event_p_local < pDStack_28)) {
      bVar3 = delay <= start_events._4_4_;
    }
    if (!bVar3) break;
    do {
      new_events._4_4_ = this->TrackDue->Delay;
      DStack_40 = new_events._4_4_ + DStack_40;
      delay = (new_events._4_4_ * (this->super_MIDIStreamer).Tempo) /
              (uint)(this->super_MIDIStreamer).Division + delay;
      AdvanceTracks(this,new_events._4_4_);
      do {
        new_events._3_1_ = 0;
        pDVar1 = SendCommand(this,max_event_p_local,this->TrackDue,DStack_40,
                             (long)pDStack_28 - (long)max_event_p_local >> 2,
                             (bool *)((long)&new_events + 3));
        if ((new_events._3_1_ & 1) != 0) {
          return max_event_p_local;
        }
        pTVar2 = FindNextDue(this);
        this->TrackDue = pTVar2;
        if (pDVar1 != max_event_p_local) {
          DStack_40 = 0;
        }
        bVar3 = false;
        if ((this->TrackDue != (TrackInfo *)0x0) && (bVar3 = false, this->TrackDue->Delay == 0)) {
          bVar3 = pDVar1 < pDStack_28;
        }
        max_event_p_local = pDVar1;
      } while (bVar3);
      bVar3 = false;
      if (_time == pDVar1) {
        bVar3 = this->TrackDue != (TrackInfo *)0x0;
      }
    } while (bVar3);
  }
  return max_event_p_local;
}

Assistant:

DWORD *MIDISong2::MakeEvents(DWORD *events, DWORD *max_event_p, DWORD max_time)
{
	DWORD *start_events;
	DWORD tot_time = 0;
	DWORD time = 0;
	DWORD delay;

	start_events = events;
	while (TrackDue && events < max_event_p && tot_time <= max_time)
	{
		// It's possible that this tick may be nothing but meta-events and
		// not generate any real events. Repeat this until we actually
		// get some output so we don't send an empty buffer to the MIDI
		// device.
		do
		{
			delay = TrackDue->Delay;
			time += delay;
			// Advance time for all tracks by the amount needed for the one up next.
			tot_time += delay * Tempo / Division;
			AdvanceTracks(delay);
			// Play all events for this tick.
			do
			{
				bool sysex_noroom = false;
				DWORD *new_events = SendCommand(events, TrackDue, time, max_event_p - events, sysex_noroom);
				if (sysex_noroom)
				{
					return events;
				}
				TrackDue = FindNextDue();
				if (new_events != events)
				{
					time = 0;
				}
				events = new_events;
			}
			while (TrackDue && TrackDue->Delay == 0 && events < max_event_p);
		}
		while (start_events == events && TrackDue);
		time = 0;
	}
	return events;
}